

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sourcePosition.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_sourcePosition_primitive_endColumn
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t sVar1;
  uint32_t local_34;
  sysbvm_tuple_t sStack_30;
  uint32_t endColumn;
  sysbvm_sourcePosition_t *sourcePosition;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  sourcePosition = (sysbvm_sourcePosition_t *)arguments;
  arguments_local = (sysbvm_tuple_t *)argumentCount;
  argumentCount_local = closure;
  closure_local = (sysbvm_tuple_t)context;
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  sStack_30 = (sourcePosition->header).field_0.typePointer;
  local_34 = 0;
  sysbvm_sourceCode_computeLineAndColumnForIndex
            ((sysbvm_context_t *)closure_local,*(sysbvm_tuple_t *)(sStack_30 + 0x10),
             *(sysbvm_tuple_t *)(sStack_30 + 0x20),(uint32_t *)0x0,&local_34);
  sVar1 = sysbvm_tuple_uint32_encode((sysbvm_context_t *)closure_local,local_34);
  return sVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_sourcePosition_primitive_endColumn(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    (void)argumentCount;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    sysbvm_sourcePosition_t *sourcePosition = (sysbvm_sourcePosition_t*)arguments[0];
    uint32_t endColumn = 0;
    sysbvm_sourceCode_computeLineAndColumnForIndex(context, sourcePosition->sourceCode, sourcePosition->endIndex, NULL, &endColumn);
    return sysbvm_tuple_uint32_encode(context, endColumn);
}